

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O2

void duckdb::AggregateExecutor::
     UnaryScatterLoop<duckdb::ModeState<float,duckdb::ModeStandard<float>>,float,duckdb::ModeFunction<duckdb::ModeStandard<float>>>
               (float *idata,AggregateInputData *aggr_input_data,
               ModeState<float,_duckdb::ModeStandard<float>_> **states,SelectionVector *isel,
               SelectionVector *ssel,ValidityMask *mask,idx_t count)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  idx_t row_idx;
  idx_t iVar4;
  idx_t i;
  idx_t iVar5;
  ulong uVar6;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    for (uVar6 = 0; count != uVar6; uVar6 = uVar6 + 1) {
      uVar2 = uVar6;
      if (isel->sel_vector != (sel_t *)0x0) {
        uVar2 = (ulong)isel->sel_vector[uVar6];
      }
      uVar3 = uVar6;
      if (ssel->sel_vector != (sel_t *)0x0) {
        uVar3 = (ulong)ssel->sel_vector[uVar6];
      }
      BaseModeFunction<duckdb::ModeStandard<float>>::
      Execute<float,duckdb::ModeState<float,duckdb::ModeStandard<float>>,duckdb::ModeFunction<duckdb::ModeStandard<float>>>
                (states[uVar3],idata + uVar2,aggr_input_data);
    }
  }
  else {
    for (iVar5 = 0; count != iVar5; iVar5 = iVar5 + 1) {
      row_idx = iVar5;
      if (isel->sel_vector != (sel_t *)0x0) {
        row_idx = (idx_t)isel->sel_vector[iVar5];
      }
      iVar4 = iVar5;
      if (ssel->sel_vector != (sel_t *)0x0) {
        iVar4 = (idx_t)ssel->sel_vector[iVar5];
      }
      bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (&mask->super_TemplatedValidityMask<unsigned_long>,row_idx);
      if (bVar1) {
        BaseModeFunction<duckdb::ModeStandard<float>>::
        Execute<float,duckdb::ModeState<float,duckdb::ModeStandard<float>>,duckdb::ModeFunction<duckdb::ModeStandard<float>>>
                  (states[iVar4],idata + row_idx,aggr_input_data);
      }
    }
  }
  return;
}

Assistant:

static inline void UnaryScatterLoop(const INPUT_TYPE *__restrict idata, AggregateInputData &aggr_input_data,
	                                    STATE_TYPE **__restrict states, const SelectionVector &isel,
	                                    const SelectionVector &ssel, ValidityMask &mask, idx_t count) {
		if (OP::IgnoreNull() && !mask.AllValid()) {
			// potential NULL values and NULL values are ignored
			AggregateUnaryInput input(aggr_input_data, mask);
			for (idx_t i = 0; i < count; i++) {
				input.input_idx = isel.get_index(i);
				auto sidx = ssel.get_index(i);
				if (mask.RowIsValid(input.input_idx)) {
					OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*states[sidx], idata[input.input_idx], input);
				}
			}
		} else {
			// quick path: no NULL values or NULL values are not ignored
			AggregateUnaryInput input(aggr_input_data, mask);
			for (idx_t i = 0; i < count; i++) {
				input.input_idx = isel.get_index(i);
				auto sidx = ssel.get_index(i);
				OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*states[sidx], idata[input.input_idx], input);
			}
		}
	}